

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

SSL_SESSION * SSL_process_tls13_new_session_ticket(SSL *ssl,uint8_t *buf,size_t buf_len)

{
  SSL_HANDSHAKE *pSVar1;
  undefined8 uVar2;
  uint16_t uVar3;
  int iVar4;
  pointer __p;
  int line;
  uint8_t type;
  UniquePtr<SSL_SESSION> session;
  CBS cbs;
  CBS body;
  uint8_t local_41;
  undefined1 local_40 [16];
  size_t local_30;
  CBS local_28;
  
  pSVar1 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
  if ((((pSVar1 == (SSL_HANDSHAKE *)0x0) || ((pSVar1->field_0x6c8 & 8) != 0)) &&
      (uVar3 = bssl::ssl_protocol_version(ssl), uVar3 == 0x304)) && ((ssl->field_0xa4 & 1) == 0)) {
    local_40._8_8_ = buf;
    local_30 = buf_len;
    iVar4 = CBS_get_u8((CBS *)(local_40 + 8),&local_41);
    if (((iVar4 != 0) &&
        (iVar4 = CBS_get_u24_length_prefixed((CBS *)(local_40 + 8),&local_28), iVar4 != 0)) &&
       (local_30 == 0)) {
      bssl::tls13_create_session_with_ticket((SSL *)local_40,(CBS *)ssl);
      uVar2 = local_40._0_8_;
      if ((ssl_session_st *)local_40._0_8_ != (ssl_session_st *)0x0) {
        local_40._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_40);
      return (ssl_session_st *)uVar2;
    }
    iVar4 = 0x89;
    line = 0xc43;
  }
  else {
    iVar4 = 0x42;
    line = 0xc39;
  }
  ERR_put_error(0x10,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,line);
  return (SSL_SESSION *)0x0;
}

Assistant:

SSL_SESSION *SSL_process_tls13_new_session_ticket(SSL *ssl, const uint8_t *buf,
                                                  size_t buf_len) {
  if (SSL_in_init(ssl) ||                             //
      ssl_protocol_version(ssl) != TLS1_3_VERSION ||  //
      ssl->server) {
    // Only TLS 1.3 clients are supported.
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return nullptr;
  }

  CBS cbs, body;
  CBS_init(&cbs, buf, buf_len);
  uint8_t type;
  if (!CBS_get_u8(&cbs, &type) ||                   //
      !CBS_get_u24_length_prefixed(&cbs, &body) ||  //
      CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  UniquePtr<SSL_SESSION> session = tls13_create_session_with_ticket(ssl, &body);
  if (!session) {
    // |tls13_create_session_with_ticket| puts the correct error.
    return nullptr;
  }
  return session.release();
}